

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  ImGuiContext *pIVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  ImVec2 this;
  ImDrawList *draw_list;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff88;
  ImDrawList *in_stack_ffffffffffffff90;
  ImDrawList *in_stack_ffffffffffffffa8;
  undefined1 intersect_with_current_clip_rect;
  ImVec2 cr_max;
  ImVec2 in_stack_ffffffffffffffc0;
  ImDrawListSharedData *in_stack_ffffffffffffffc8;
  ImDrawList *in_stack_ffffffffffffffd0;
  ImDrawList *local_28;
  
  pIVar1 = GImGui;
  local_28 = *(ImDrawList **)(in_RDI + 0x38 + in_RSI * 8);
  if (local_28 == (ImDrawList *)0x0) {
    ImGui::MemAlloc((size_t)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffffa8 = (ImDrawList *)operator_new(200);
    ImDrawList::ImDrawList(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffa8->_OwnerName = in_RDX;
    *(ImDrawList **)(in_RDI + 0x38 + in_RSI * 8) = in_stack_ffffffffffffffa8;
    local_28 = in_stack_ffffffffffffffa8;
  }
  intersect_with_current_clip_rect = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  if (*(int *)(in_RDI + 0x30 + in_RSI * 4) != pIVar1->FrameCount) {
    ImDrawList::_ResetForNewFrame((ImDrawList *)in_stack_ffffffffffffffc0);
    ImDrawList::PushTextureID(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    cr_max = *(ImVec2 *)(in_RDI + 4);
    this = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x1196de);
    ImDrawList::PushClipRect
              ((ImDrawList *)this,in_stack_ffffffffffffffc0,cr_max,
               (bool)intersect_with_current_clip_rect);
    *(int *)(in_RDI + 0x30 + in_RSI * 4) = pIVar1->FrameCount;
  }
  return local_28;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->DrawListsLastFrame[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->DrawListsLastFrame[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}